

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::HasWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *desc)

{
  bool bVar1;
  uint256 *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&this->cs_desc_man,
             "cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xa81,false);
  this_00 = &(this->m_wallet_descriptor).id;
  bVar1 = base_blob<256U>::IsNull(&this_00->super_base_blob<256U>);
  if (!bVar1) {
    bVar1 = base_blob<256U>::IsNull(&(desc->id).super_base_blob<256U>);
    if (!bVar1) {
      bVar1 = ::operator==(&this_00->super_base_blob<256U>,&(desc->id).super_base_blob<256U>);
      goto LAB_0096b3e5;
    }
  }
  bVar1 = false;
LAB_0096b3e5:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::HasWalletDescriptor(const WalletDescriptor& desc) const
{
    LOCK(cs_desc_man);
    return !m_wallet_descriptor.id.IsNull() && !desc.id.IsNull() && m_wallet_descriptor.id == desc.id;
}